

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::CData(cmXMLWriter *this,string *data)

{
  ostream *poVar1;
  string *data_local;
  cmXMLWriter *this_local;
  
  PreContent(this);
  poVar1 = std::operator<<(this->Output,"<![CDATA[");
  poVar1 = std::operator<<(poVar1,(string *)data);
  std::operator<<(poVar1,"]]>");
  return;
}

Assistant:

void cmXMLWriter::CData(std::string const& data)
{
  this->PreContent();
  this->Output << "<![CDATA[" << data << "]]>";
}